

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O3

void __thiscall
iu_FileSystemTest_x_iutest_x_FileSize64bit_Test::Body
          (iu_FileSystemTest_x_iutest_x_FileSize64bit_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParamType *pPVar2;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  uintmax_t expectedSize;
  allocator<char> local_241;
  AssertionResult local_240;
  AssertionHelper local_218;
  IFile local_1e8;
  FILE *local_1d8;
  string local_1d0;
  ParamType local_1b0;
  undefined1 local_1a8 [392];
  
  pPVar2 = iutest::WithParamInterface<unsigned_long>::GetParam();
  local_1b0 = *pPVar2;
  local_1a8._0_8_ = std::filesystem::file_size(&largefile_abi_cxx11_);
  iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&local_240,(internal *)"expectedSize","::std::filesystem::file_size(largefile)",
             (char *)&local_1b0,(unsigned_long *)local_1a8,in_R9);
  if (local_240.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_240.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d0);
    local_218.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_218.m_part_result.super_iuCodeMessage.m_line = 0x67;
    local_218.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_message._M_dataplus._M_p == &local_240.m_message.field_2) {
      return;
    }
    operator_delete(local_240.m_message._M_dataplus._M_p,
                    CONCAT71(local_240.m_message.field_2._M_allocated_capacity._1_7_,
                             local_240.m_message.field_2._M_local_buf[0]) + 1);
    return;
  }
  paVar1 = &local_240.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.m_message._M_dataplus._M_p,
                    CONCAT71(local_240.m_message.field_2._M_allocated_capacity._1_7_,
                             local_240.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1e8.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00183ef8;
  local_1e8.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00183f48;
  local_1d8 = (FILE *)0x0;
  local_240.m_result = iutest::IFile::Open(&local_1e8,&largefile_abi_cxx11_,1);
  local_240.m_message._M_string_length = 0;
  local_240.m_message.field_2._M_local_buf[0] = '\0';
  local_240.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_240.m_result) {
    local_1a8._0_8_ = iutest::StdioFile::GetSize((FILE *)local_1d8);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_240,(internal *)"expectedSize","file.GetSize()",(char *)&local_1b0,
               (unsigned_long *)local_1a8,in_R9);
    if (local_240.m_result != false) goto LAB_00146ac0;
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_240.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d0);
    local_218.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_218.m_part_result.super_iuCodeMessage.m_line = 0x6c;
    local_218.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
    local_1d0.field_2._M_allocated_capacity =
         local_218.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    local_1d0._M_dataplus._M_p =
         local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) goto LAB_00146a97;
  }
  else {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)&local_240,
               (AssertionResult *)"file.Open(largefile, iutest::IFile::OpenRead)","false","true",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1d0._M_dataplus._M_p,&local_241);
    local_218.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_218.m_part_result.super_iuCodeMessage.m_line = 0x6a;
    local_218.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_00146a97:
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
LAB_00146ac0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.m_message._M_dataplus._M_p,
                    CONCAT71(local_240.m_message.field_2._M_allocated_capacity._1_7_,
                             local_240.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1e8.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00183ef8;
  local_1e8.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00183f48;
  if (local_1d8 != (FILE *)0x0) {
    fclose(local_1d8);
  }
  return;
}

Assistant:

IUTEST_P(FileSystemTest, FileSize64bit)
{
    const uintmax_t expectedSize = GetParam();
    IUTEST_ASSUME_EQ(expectedSize, ::std::filesystem::file_size(largefile));

    ::iutest::StdioFile file;
    IUTEST_ASSERT_TRUE( file.Open(largefile, iutest::IFile::OpenRead) );
#if IUTEST_HAS_FILENO && IUTEST_HAS_FILE_STAT
    IUTEST_EXPECT_EQ(expectedSize, file.GetSize());
#else
    IUTEST_INFORM_EQ(expectedSize, file.GetSize());
#endif
}